

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O3

int get_crl_sk(X509_STORE_CTX *ctx,X509_CRL **pcrl,X509 **pissuer,int *pscore,
              stack_st_X509_CRL *crls)

{
  uint uVar1;
  X509 *a;
  DIST_POINT_NAME *pDVar2;
  OPENSSL_STACK *sk;
  X509_CRL **ppXVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  X509_CRL *crl;
  X509_NAME *pXVar7;
  X509_NAME *pXVar8;
  size_t sVar9;
  X509 *issuer;
  size_t sVar10;
  long *plVar11;
  GENERAL_NAME *a_00;
  GENERAL_NAME *b;
  int *piVar12;
  size_t sVar13;
  ASN1_TIME *from;
  ASN1_TIME *to;
  uint uVar14;
  int sec;
  int day;
  uint local_98;
  X509_CRL *local_88;
  DIST_POINT_NAME *local_80;
  X509_NAME *local_78;
  X509 *local_70;
  size_t local_60;
  int local_58;
  int local_54;
  X509_STORE_CTX *local_50;
  X509 **local_48;
  uint *local_40;
  X509_CRL **local_38;
  
  local_98 = *pscore;
  a = (X509 *)ctx->current_cert;
  local_38 = pcrl;
  sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)crls);
  if (sVar6 != 0) {
    sVar6 = 0;
    local_70 = (X509 *)0x0;
    local_88 = (X509_CRL *)0x0;
    local_48 = pissuer;
    local_40 = (uint *)pscore;
    do {
      crl = (X509_CRL *)OPENSSL_sk_value((OPENSSL_STACK *)crls,sVar6);
      if ((crl->idp_flags & 0x62) == 0) {
        pXVar7 = X509_get_issuer_name(a);
        pXVar8 = X509_CRL_get_issuer(crl);
        iVar4 = X509_NAME_cmp(pXVar7,(X509_NAME *)pXVar8);
        if (iVar4 == 0) {
          uVar1 = crl->flags;
          iVar5 = check_crl_time(ctx,crl,0);
          pXVar8 = X509_CRL_get_issuer(crl);
          iVar4 = ctx->error_depth;
          sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
          sVar9 = (ulong)(sVar9 - 1 != (long)iVar4) + (long)iVar4;
          issuer = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,sVar9);
          iVar4 = X509_check_akid(issuer,(AUTHORITY_KEYID *)crl->akid);
          if (iVar4 == 0) {
            uVar14 = 0x1c;
LAB_00497008:
            uVar14 = (uint)((uVar1 >> 9 & 1) == 0) * 0x100 + iVar5 * 0x40 + 0x20 | uVar14;
            uVar1 = crl->idp_flags;
            if ((uVar1 & 0x10) == 0) {
              if (((a->ex_data).dummy & 0x10) == 0) {
                uVar1 = uVar1 & 8;
              }
              else {
                uVar1 = uVar1 & 4;
              }
              if (uVar1 == 0) {
                local_50 = ctx;
                sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)a->ex_kusage);
                if (sVar9 != 0) {
                  sVar9 = 0;
                  do {
                    plVar11 = (long *)OPENSSL_sk_value((OPENSSL_STACK *)a->ex_kusage,sVar9);
                    if ((plVar11[1] == 0) && (plVar11[2] == 0)) {
                      if ((crl->idp == (ISSUING_DIST_POINT *)0x0) ||
                         ((pDVar2 = (DIST_POINT_NAME *)*plVar11, pDVar2 == (DIST_POINT_NAME *)0x0 ||
                          (local_80 = crl->idp->distpoint, local_80 == (DIST_POINT_NAME *)0x0))))
                      goto LAB_0049724a;
                      if (pDVar2->type == 1) {
                        local_78 = pDVar2->dpname;
                        if (local_78 != (X509_NAME *)0x0) {
                          if (local_80->type == 1) {
                            if ((local_80->dpname != (X509_NAME *)0x0) &&
                               (iVar4 = X509_NAME_cmp((X509_NAME *)local_78,
                                                      (X509_NAME *)local_80->dpname), iVar4 == 0))
                            goto LAB_0049724a;
                          }
                          else {
LAB_004971cd:
                            sk = (OPENSSL_STACK *)(local_80->name).fullname;
                            sVar10 = OPENSSL_sk_num(sk);
                            if (sVar10 != 0) {
                              sVar10 = 0;
                              do {
                                piVar12 = (int *)OPENSSL_sk_value(sk,sVar10);
                                if ((*piVar12 == 4) &&
                                   (iVar4 = X509_NAME_cmp((X509_NAME *)local_78,
                                                          *(X509_NAME **)(piVar12 + 2)), iVar4 == 0)
                                   ) goto LAB_0049724a;
                                sVar10 = sVar10 + 1;
                                sVar13 = OPENSSL_sk_num(sk);
                              } while (sVar10 < sVar13);
                            }
                          }
                        }
                      }
                      else if (local_80->type == 1) {
                        local_78 = local_80->dpname;
                        local_80 = pDVar2;
                        if (local_78 != (X509_NAME *)0x0) goto LAB_004971cd;
                      }
                      else {
                        sVar10 = OPENSSL_sk_num((OPENSSL_STACK *)(pDVar2->name).fullname);
                        if (sVar10 != 0) {
                          local_60 = 0;
                          do {
                            a_00 = (GENERAL_NAME *)
                                   OPENSSL_sk_value((OPENSSL_STACK *)(pDVar2->name).fullname,
                                                    local_60);
                            sVar10 = OPENSSL_sk_num((OPENSSL_STACK *)(local_80->name).fullname);
                            if (sVar10 != 0) {
                              sVar10 = 0;
                              do {
                                b = (GENERAL_NAME *)
                                    OPENSSL_sk_value((OPENSSL_STACK *)(local_80->name).fullname,
                                                     sVar10);
                                iVar4 = GENERAL_NAME_cmp(a_00,b);
                                if (iVar4 == 0) goto LAB_0049724a;
                                sVar10 = sVar10 + 1;
                                sVar13 = OPENSSL_sk_num((OPENSSL_STACK *)(local_80->name).fullname);
                              } while (sVar10 < sVar13);
                            }
                            local_60 = local_60 + 1;
                            sVar10 = OPENSSL_sk_num((OPENSSL_STACK *)(pDVar2->name).fullname);
                          } while (local_60 < sVar10);
                        }
                      }
                    }
                    sVar9 = sVar9 + 1;
                    sVar10 = OPENSSL_sk_num((OPENSSL_STACK *)a->ex_kusage);
                  } while (sVar9 < sVar10);
                }
                if ((crl->idp == (ISSUING_DIST_POINT *)0x0) ||
                   (ctx = local_50, crl->idp->distpoint == (DIST_POINT_NAME *)0x0)) {
LAB_0049724a:
                  uVar14 = uVar14 | 0x80;
                  ctx = local_50;
                }
              }
            }
            if ((int)local_98 <= (int)uVar14) {
              if ((uVar14 == local_98) && (local_88 != (X509_CRL *)0x0)) {
                from = X509_CRL_get0_lastUpdate(local_88);
                to = X509_CRL_get0_lastUpdate(crl);
                iVar4 = ASN1_TIME_diff(&local_54,&local_58,from,to);
                if ((iVar4 == 0) || ((local_54 < 1 && (local_58 < 1)))) goto LAB_004972d4;
              }
              local_98 = uVar14;
              local_88 = crl;
              local_70 = issuer;
            }
          }
          else {
            iVar4 = (int)sVar9 + 1;
            sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
            if (iVar4 < (int)sVar9) {
              sVar9 = (size_t)iVar4;
              do {
                issuer = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,sVar9);
                pXVar7 = X509_get_subject_name(issuer);
                iVar4 = X509_NAME_cmp(pXVar7,(X509_NAME *)pXVar8);
                if ((iVar4 == 0) &&
                   (iVar4 = X509_check_akid(issuer,(AUTHORITY_KEYID *)crl->akid), iVar4 == 0)) {
                  uVar14 = 0xc;
                  goto LAB_00497008;
                }
                sVar9 = sVar9 + 1;
                sVar10 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
              } while ((long)sVar9 < (long)(int)sVar10);
            }
          }
        }
      }
LAB_004972d4:
      sVar6 = sVar6 + 1;
      sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)crls);
      ppXVar3 = local_38;
    } while (sVar6 < sVar9);
    if (local_88 != (X509_CRL *)0x0) {
      if ((X509_CRL *)*local_38 != (X509_CRL *)0x0) {
        X509_CRL_free((X509_CRL *)*local_38);
      }
      *ppXVar3 = local_88;
      *local_48 = (X509 *)local_70;
      *local_40 = local_98;
      X509_CRL_up_ref(local_88);
    }
  }
  return (int)(0x1bf < (int)local_98);
}

Assistant:

static int get_crl_sk(X509_STORE_CTX *ctx, X509_CRL **pcrl, X509 **pissuer,
                      int *pscore, STACK_OF(X509_CRL) *crls) {
  int crl_score, best_score = *pscore;
  X509 *x = ctx->current_cert;
  X509_CRL *best_crl = NULL;
  X509 *crl_issuer = NULL, *best_crl_issuer = NULL;

  for (size_t i = 0; i < sk_X509_CRL_num(crls); i++) {
    X509_CRL *crl = sk_X509_CRL_value(crls, i);
    crl_score = get_crl_score(ctx, &crl_issuer, crl, x);
    if (crl_score < best_score || crl_score == 0) {
      continue;
    }
    // If current CRL is equivalent use it if it is newer
    if (crl_score == best_score && best_crl != NULL) {
      int day, sec;
      if (ASN1_TIME_diff(&day, &sec, X509_CRL_get0_lastUpdate(best_crl),
                         X509_CRL_get0_lastUpdate(crl)) == 0) {
        continue;
      }
      // ASN1_TIME_diff never returns inconsistent signs for |day|
      // and |sec|.
      if (day <= 0 && sec <= 0) {
        continue;
      }
    }
    best_crl = crl;
    best_crl_issuer = crl_issuer;
    best_score = crl_score;
  }

  if (best_crl) {
    if (*pcrl) {
      X509_CRL_free(*pcrl);
    }
    *pcrl = best_crl;
    *pissuer = best_crl_issuer;
    *pscore = best_score;
    X509_CRL_up_ref(best_crl);
  }

  if (best_score >= CRL_SCORE_VALID) {
    return 1;
  }

  return 0;
}